

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

LBBox3fa * __thiscall
embree::SceneGraph::GroupNode::lbounds(LBBox3fa *__return_storage_ptr__,GroupNode *this)

{
  pointer pRVar1;
  pointer pRVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  pRVar2 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  aVar3 = _DAT_00264800;
  aVar4 = _DAT_002647f0;
  aVar5 = _DAT_00264800;
  aVar6 = _DAT_002647f0;
  if (pRVar2 != pRVar1) {
    do {
      (*(pRVar2->ptr->super_RefCount)._vptr_RefCount[0xc])(local_68);
      aVar6.m128 = (__m128)minps(aVar6.m128,local_68);
      aVar3.m128 = (__m128)maxps(aVar3.m128,local_58);
      aVar4.m128 = (__m128)minps(aVar4.m128,local_48);
      aVar5.m128 = (__m128)maxps(aVar5.m128,local_38);
      pRVar2 = pRVar2 + 1;
    } while (pRVar2 != pRVar1);
  }
  (__return_storage_ptr__->bounds0).lower.field_0 = aVar6;
  (__return_storage_ptr__->bounds0).upper.field_0 = aVar3;
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar4;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar5;
  return __return_storage_ptr__;
}

Assistant:

virtual LBBox3fa lbounds() const
      {
        LBBox3fa b = empty;
        for (auto& c : children) b.extend(c->lbounds());
        return b;
      }